

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void tf::throw_re<char_const(&)[36]>(char *fname,size_t line,char (*args) [36])

{
  ostream *poVar1;
  runtime_error *this;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  char (*args_local) [36];
  size_t line_local;
  char *fname_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"[");
  poVar1 = std::operator<<(poVar1,fname);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  std::operator<<(poVar1,"] ");
  std::operator<<((ostream *)local_198,*args);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_re(const char* fname, const size_t line, ArgsT&&... args) {
  std::ostringstream oss;
  oss << "[" << fname << ":" << line << "] ";
  //ostreamize(oss, std::forward<ArgsT>(args)...);
  (oss << ... << args);
  throw std::runtime_error(oss.str());
}